

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_ascii_from_fixed(png_const_structrp png_ptr,png_charp ascii,size_t size,png_fixed_point fp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char digits [10];
  char acStack_31 [17];
  
  if (0xc < size) {
    if (fp < 0) {
      *ascii = '-';
      ascii = ascii + 1;
      fp = -fp;
    }
    acStack_31[9] = '\0';
    acStack_31[10] = '\0';
    acStack_31[1] = '\0';
    acStack_31[2] = '\0';
    acStack_31[3] = '\0';
    acStack_31[4] = '\0';
    acStack_31[5] = '\0';
    acStack_31[6] = '\0';
    acStack_31[7] = '\0';
    acStack_31[8] = '\0';
    if (fp == 0) {
      uVar2 = 0x10;
      uVar7 = 0;
    }
    else {
      uVar2 = 0x10;
      uVar6 = 0;
      do {
        uVar5 = (int)uVar6 + 1;
        uVar7 = (ulong)uVar5;
        acStack_31[uVar6 + 1] = (char)((uint)fp % 10) + '0';
        uVar3 = uVar2;
        if ((uint)fp % 10 != 0) {
          uVar3 = uVar5;
        }
        if (uVar2 == 0x10) {
          uVar2 = uVar3;
        }
        bVar1 = 9 < (uint)fp;
        uVar6 = uVar7;
        fp = (uint)fp / 10;
      } while (bVar1);
    }
    if ((uint)uVar7 == 0) {
      *ascii = '0';
      ascii = ascii + 1;
    }
    else {
      if (5 < (uint)uVar7) {
        do {
          pcVar4 = acStack_31 + uVar7;
          uVar7 = uVar7 - 1;
          *ascii = *pcVar4;
          ascii = ascii + 1;
        } while (5 < uVar7);
      }
      if (uVar2 < 6) {
        *ascii = '.';
        pcVar4 = ascii + 1;
        if ((uint)uVar7 < 5) {
          uVar6 = (ulong)(4 - (uint)uVar7);
          memset(pcVar4,0x30,uVar6 + 1);
          pcVar4 = ascii + uVar6 + 2;
        }
        while (ascii = pcVar4, uVar2 <= (uint)uVar7) {
          uVar7 = (ulong)((uint)uVar7 - 1);
          *pcVar4 = acStack_31[uVar7 + 1];
          pcVar4 = pcVar4 + 1;
        }
      }
    }
    *ascii = '\0';
    return;
  }
  png_error(png_ptr,"ASCII conversion buffer too small");
}

Assistant:

void /* PRIVATE */
png_ascii_from_fixed(png_const_structrp png_ptr, png_charp ascii,
    size_t size, png_fixed_point fp)
{
   /* Require space for 10 decimal digits, a decimal point, a minus sign and a
    * trailing \0, 13 characters:
    */
   if (size > 12)
   {
      png_uint_32 num;

      /* Avoid overflow here on the minimum integer. */
      if (fp < 0)
      {
         *ascii++ = 45; num = (png_uint_32)(-fp);
      }
      else
         num = (png_uint_32)fp;

      if (num <= 0x80000000) /* else overflowed */
      {
         unsigned int ndigits = 0, first = 16 /* flag value */;
         char digits[10] = {0};

         while (num)
         {
            /* Split the low digit off num: */
            unsigned int tmp = num/10;
            num -= tmp*10;
            digits[ndigits++] = (char)(48 + num);
            /* Record the first non-zero digit, note that this is a number
             * starting at 1, it's not actually the array index.
             */
            if (first == 16 && num > 0)
               first = ndigits;
            num = tmp;
         }

         if (ndigits > 0)
         {
            while (ndigits > 5) *ascii++ = digits[--ndigits];
            /* The remaining digits are fractional digits, ndigits is '5' or
             * smaller at this point.  It is certainly not zero.  Check for a
             * non-zero fractional digit:
             */
            if (first <= 5)
            {
               unsigned int i;
               *ascii++ = 46; /* decimal point */
               /* ndigits may be <5 for small numbers, output leading zeros
                * then ndigits digits to first:
                */
               i = 5;
               while (ndigits < i)
               {
                  *ascii++ = 48; --i;
               }
               while (ndigits >= first) *ascii++ = digits[--ndigits];
               /* Don't output the trailing zeros! */
            }
         }
         else
            *ascii++ = 48;

         /* And null terminate the string: */
         *ascii = 0;
         return;
      }
   }

   /* Here on buffer too small. */
   png_error(png_ptr, "ASCII conversion buffer too small");
}